

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O0

string * __thiscall
testing::internal::FormatCompilerIndependentFileLocation_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,char *file,int line)

{
  char *__s;
  undefined8 in_R8;
  undefined8 in_R9;
  internal *local_80;
  allocator<char> local_61;
  string local_60;
  allocator<char> local_29;
  internal *local_28;
  char *file_name;
  internal *piStack_18;
  int line_local;
  char *file_local;
  
  file_name._4_4_ = (int)file;
  local_80 = this;
  if (this == (internal *)0x0) {
    local_80 = (internal *)0x19b80b;
  }
  local_28 = local_80;
  piStack_18 = this;
  file_local = (char *)__return_storage_ptr__;
  if (file_name._4_4_ < 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,(char *)local_80,&local_29);
    std::allocator<char>::~allocator(&local_29);
  }
  else {
    String::Format_abi_cxx11_
              (&local_60,"%s:%d",local_80,(ulong)file & 0xffffffff,in_R8,in_R9,&local_60);
    __s = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,&local_61);
    std::allocator<char>::~allocator(&local_61);
    std::__cxx11::string::~string((string *)&local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

GTEST_API_ ::std::string FormatCompilerIndependentFileLocation(
    const char* file, int line) {
  const char* const file_name = file == NULL ? kUnknownFile : file;

  if (line < 0)
    return file_name;
  else
    return String::Format("%s:%d", file_name, line).c_str();
}